

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

int expand_rule(jsgf_t *grammar,jsgf_rule_t *rule)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char *__s1;
  bool bVar4;
  jsgf_rule_t *pjVar5;
  int iVar6;
  int32 iVar7;
  glist_t pgVar8;
  jsgf_rhs_t *pjVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  undefined8 *puVar14;
  glist_t pgVar15;
  undefined8 *puVar16;
  gnode_t *pgVar17;
  undefined4 uVar18;
  ulong uVar19;
  float fVar20;
  uint local_7c;
  jsgf_rule_t *local_50;
  undefined1 local_48 [16];
  
  pgVar8 = glist_add_ptr(grammar->rulestack,rule);
  grammar->rulestack = pgVar8;
  fVar20 = 0.0;
  for (pjVar9 = rule->rhs; pjVar9 != (jsgf_rhs_t *)0x0; pjVar9 = pjVar9->alt) {
    if (pjVar9->atoms != (glist_t)0x0) {
      fVar20 = fVar20 + *(float *)((pjVar9->atoms->data).i + 0x10);
    }
  }
  iVar6 = grammar->nstate;
  grammar->nstate = iVar6 + 1;
  rule->entry = iVar6;
  grammar->nstate = iVar6 + 2;
  rule->exit = iVar6 + 1;
  pjVar9 = rule->rhs;
  if (pjVar9 != (jsgf_rhs_t *)0x0) {
    local_48 = ZEXT416(~-(uint)(fVar20 == 0.0) & (uint)fVar20 | -(uint)(fVar20 == 0.0) & 0x3f800000)
    ;
    do {
      if (pjVar9->atoms != (glist_t)0x0) {
        lVar3 = (pjVar9->atoms->data).i;
        *(float *)(lVar3 + 0x10) = *(float *)(lVar3 + 0x10) / (float)local_48._0_4_;
      }
      uVar19 = (ulong)(uint)rule->entry;
      for (pgVar8 = pjVar9->atoms; pgVar8 != (glist_t)0x0; pgVar8 = pgVar8->next) {
        puVar16 = (undefined8 *)(pgVar8->data).ptr;
        uVar18 = (undefined4)uVar19;
        if (*(char *)*puVar16 == '<') {
          __s1 = (char *)*puVar16;
          iVar6 = strcmp(__s1,"<NULL>");
          if (iVar6 == 0) {
            iVar6 = grammar->nstate;
            puVar14 = (undefined8 *)
                      __ckd_calloc__(1,0x10,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xc1);
            *(undefined4 *)(puVar14 + 1) = uVar18;
            *(int *)((long)puVar14 + 0xc) = iVar6;
            *puVar14 = puVar16;
            pgVar15 = glist_add_ptr(grammar->links,puVar14);
            grammar->links = pgVar15;
            uVar19 = (ulong)(uint)grammar->nstate;
            grammar->nstate = grammar->nstate + 1;
            bVar4 = false;
          }
          else {
            iVar6 = strcmp(__s1,"<VOID>");
            bVar4 = true;
            if (iVar6 != 0) {
              pcVar10 = strchr(__s1 + 1,0x2e);
              if (pcVar10 == (char *)0x0) {
                pcVar10 = __ckd_salloc__(rule->name + 1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                         ,0xcc);
                pcVar11 = strrchr(pcVar10 + 1,0x2e);
                if (pcVar11 == (char *)0x0) {
                  ckd_free(pcVar10);
                  pcVar10 = (char *)0x0;
                }
                else {
                  *pcVar11 = '\0';
                }
                if (pcVar10 == (char *)0x0) {
                  iVar6 = 0xf5;
                  goto LAB_001078a3;
                }
                sVar12 = strlen(pcVar10);
                sVar13 = strlen(__s1);
                pcVar11 = (char *)__ckd_malloc__(sVar12 + sVar13 + 4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                                 ,0xf6);
                sprintf(pcVar11,"<%s.%s",pcVar10,__s1 + 1);
                ckd_free(pcVar10);
              }
              else {
                iVar6 = 0xf1;
LAB_001078a3:
                pcVar11 = __ckd_salloc__(__s1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                         ,iVar6);
              }
              iVar7 = hash_table_lookup(grammar->rules,pcVar11,&local_50);
              if (iVar7 != -1) {
                ckd_free(pcVar11);
                pjVar5 = local_50;
                for (pgVar15 = grammar->rulestack; pgVar15 != (glist_t)0x0; pgVar15 = pgVar15->next)
                {
                  if ((jsgf_rule_t *)(pgVar15->data).ptr == local_50) {
                    if (pgVar8->next != (gnode_s *)0x0) {
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                              ,0x150,"Only right-recursion is permitted (in %s.%s)\n",grammar->name,
                              rule->name);
                      goto LAB_00107b05;
                    }
                    bVar4 = true;
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0x155,"Right recursion %s %d => %d\n",*puVar16,uVar19,local_50->entry);
                    iVar6 = pjVar5->entry;
                    puVar14 = (undefined8 *)
                              __ckd_calloc__(1,0x10,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                             ,0xc1);
                    *(undefined4 *)(puVar14 + 1) = uVar18;
                    *(int *)((long)puVar14 + 0xc) = iVar6;
                    *puVar14 = puVar16;
                    pgVar15 = glist_add_ptr(grammar->links,puVar14);
                    grammar->links = pgVar15;
                    local_7c = 0xfffffffe;
                    goto LAB_00107b9e;
                  }
                }
                iVar6 = expand_rule(grammar,local_50);
                if (iVar6 != -1) {
                  iVar6 = pjVar5->entry;
                  puVar14 = (undefined8 *)
                            __ckd_calloc__(1,0x10,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                           ,0xc1);
                  *(undefined4 *)(puVar14 + 1) = uVar18;
                  *(int *)((long)puVar14 + 0xc) = iVar6;
                  *puVar14 = puVar16;
                  pgVar15 = glist_add_ptr(grammar->links,puVar14);
                  grammar->links = pgVar15;
                  uVar1 = pjVar5->exit;
                  goto LAB_001078f5;
                }
LAB_00107b05:
                local_7c = 0xffffffff;
                goto LAB_00107b9e;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                      ,0x13e,"Undefined rule in RHS: %s\n",pcVar11);
              ckd_free(pcVar11);
            }
            local_7c = 0xffffffff;
          }
        }
        else {
          iVar6 = grammar->nstate;
          puVar14 = (undefined8 *)
                    __ckd_calloc__(1,0x10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                   ,0xc1);
          *(undefined4 *)(puVar14 + 1) = uVar18;
          *(int *)((long)puVar14 + 0xc) = iVar6;
          *puVar14 = puVar16;
          pgVar15 = glist_add_ptr(grammar->links,puVar14);
          grammar->links = pgVar15;
          uVar1 = grammar->nstate;
          grammar->nstate = uVar1 + 1;
LAB_001078f5:
          uVar19 = (ulong)uVar1;
          bVar4 = false;
        }
LAB_00107b9e:
        if (bVar4) {
          uVar19 = (ulong)local_7c;
          break;
        }
      }
      iVar6 = (int)uVar19;
      if (iVar6 != -2) {
        if (iVar6 == -1) {
          return -1;
        }
        iVar2 = rule->exit;
        puVar16 = (undefined8 *)
                  __ckd_calloc__(1,0x10,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                 ,0xc1);
        *(int *)(puVar16 + 1) = iVar6;
        *(int *)((long)puVar16 + 0xc) = iVar2;
        *puVar16 = 0;
        pgVar8 = glist_add_ptr(grammar->links,puVar16);
        grammar->links = pgVar8;
      }
      pjVar9 = pjVar9->alt;
    } while (pjVar9 != (jsgf_rhs_t *)0x0);
  }
  pgVar17 = gnode_free(grammar->rulestack,(gnode_t *)0x0);
  grammar->rulestack = pgVar17;
  return rule->exit;
}

Assistant:

static int
expand_rule(jsgf_t * grammar, jsgf_rule_t * rule)
{
    jsgf_rhs_t *rhs;
    float norm;

    /* Push this rule onto the stack */
    grammar->rulestack = glist_add_ptr(grammar->rulestack, rule);

    /* Normalize weights for all alternatives exiting rule->entry */
    norm = 0;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
            norm += atom->weight;
        }
    }

    rule->entry = grammar->nstate++;
    rule->exit = grammar->nstate++;
    if (norm == 0) norm = 1;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        int lastnode;

        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
	    atom->weight /= norm;
        }
        lastnode = expand_rhs(grammar, rule, rhs);
        if (lastnode == -1) {
            return -1;
        }
        else if (lastnode == RECURSION) {
            /* Do nothing. */
        }
        else {
            jsgf_add_link(grammar, NULL, lastnode, rule->exit);
        }
    }

    /* Pop this rule from the rule stack */
    grammar->rulestack = gnode_free(grammar->rulestack, NULL);
    return rule->exit;
}